

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O3

void __thiscall
chaiscript::detail::Any::Any<std::shared_ptr<long_const>const&,void>
          (Any *this,shared_ptr<const_long> *t_value)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Head_base<0UL,_chaiscript::detail::Any::Data_*,_false> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  
  _Var3._M_head_impl = (Data *)operator_new(0x20);
  peVar1 = (t_value->super___shared_ptr<const_long,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (t_value->super___shared_ptr<const_long,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (_Var3._M_head_impl)->m_type = (type_info *)&std::shared_ptr<long_const>::typeinfo;
  (_Var3._M_head_impl)->_vptr_Data = (_func_int **)&PTR__Data_Impl_0019d698;
  _Var3._M_head_impl[1]._vptr_Data = (_func_int **)peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(_Var3._M_head_impl + 1) + 8) = p_Var2;
  (this->m_data)._M_t.
  super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
  ._M_t.
  super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
  .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl = _Var3._M_head_impl;
  return;
}

Assistant:

explicit Any(ValueType &&t_value)
          : m_data(std::make_unique<Data_Impl<std::decay_t<ValueType>>>(std::forward<ValueType>(t_value))) {
      }